

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O0

void __thiscall Command_Bad_Test::TestBody(Command_Bad_Test *this)

{
  mock_cp *pmVar1;
  MockSpec<void_(const_pstore::broker::broker_command_&)> *this_00;
  TypedExpectation<void_(const_pstore::broker::broker_command_&)> *this_01;
  fifo_path *fifo;
  allocator local_209;
  string local_208;
  undefined1 local_1e4 [8];
  message_type msg;
  allocator local_a9;
  string local_a8;
  broker_command local_88;
  Matcher<const_pstore::broker::broker_command_&> local_48;
  MockSpec<void_(const_pstore::broker::broker_command_&)> local_30;
  Command_Bad_Test *local_10;
  Command_Bad_Test *this_local;
  
  local_10 = this;
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"bad",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(msg.payload._M_elems + 0xf0),"command",
             (allocator *)(msg.payload._M_elems + 0xef));
  pstore::broker::broker_command::broker_command
            (&local_88,&local_a8,(string *)(msg.payload._M_elems + 0xf0));
  testing::Matcher<const_pstore::broker::broker_command_&>::Matcher(&local_48,&local_88);
  anon_unknown.dwarf_1d72e::mock_cp::gmock_unknown(&local_30,pmVar1,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(const_pstore::broker::broker_command_&)>::operator()
                      (&local_30,(WithoutMatchers *)(msg.payload._M_elems + 0xee),(void *)0x0);
  this_01 = testing::internal::MockSpec<void_(const_pstore::broker::broker_command_&)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_command.cpp"
                               ,0x6a,"cp ()",
                               "unknown (pstore::broker::broker_command{\"bad\", \"command\"})");
  testing::internal::TypedExpectation<void_(const_pstore::broker::broker_command_&)>::Times
            (this_01,1);
  testing::internal::MockSpec<void_(const_pstore::broker::broker_command_&)>::~MockSpec(&local_30);
  testing::Matcher<const_pstore::broker::broker_command_&>::~Matcher(&local_48);
  pstore::broker::broker_command::~broker_command(&local_88);
  std::__cxx11::string::~string((string *)(msg.payload._M_elems + 0xf0));
  std::allocator<char>::~allocator((allocator<char> *)(msg.payload._M_elems + 0xef));
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"bad command",&local_209);
  pstore::brokerface::message_type::message_type((message_type *)local_1e4,0,0,1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  pmVar1 = anon_unknown.dwarf_1d72e::Command::cp(&this->super_Command);
  fifo = anon_unknown.dwarf_1d72e::Command::fifo(&this->super_Command);
  pstore::broker::command_processor::process_command
            (&pmVar1->super_command_processor,fifo,(message_type *)local_1e4);
  return;
}

Assistant:

TEST_F (Command, Bad) {
    EXPECT_CALL (cp (), unknown (pstore::broker::broker_command{"bad", "command"})).Times (1);

    pstore::brokerface::message_type msg{message_id, part_no, num_parts, "bad command"};
    cp ().process_command (fifo (), msg);
}